

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteTranslational.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkRevoluteTranslational::Update
          (ChLinkRevoluteTranslational *this,double time,bool update_assets)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ChBodyFrame *pCVar17;
  ChBodyFrame *pCVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  ChVector<double> p2_abs;
  ChVector<double> p1_abs;
  ulong local_70;
  ulong local_48;
  double local_40;
  ulong local_38;
  ulong local_30;
  double local_28;
  ulong local_20;
  
  ChLink::UpdateTime(&this->super_ChLink,time);
  pCVar17 = (this->super_ChLink).Body1;
  ChTransform<double>::TransformLocalToParent
            (&this->m_p1,&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
             &(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
  pCVar17 = (this->super_ChLink).Body2;
  ChTransform<double>::TransformLocalToParent
            (&this->m_p2,&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
             &(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
  dVar2 = (this->m_z1).m_data[0];
  auVar72._8_8_ = 0;
  auVar72._0_8_ = dVar2;
  dVar3 = (this->m_z1).m_data[1];
  auVar69._8_8_ = 0;
  auVar69._0_8_ = dVar3;
  pCVar17 = (this->super_ChLink).Body1;
  pCVar18 = (this->super_ChLink).Body2;
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar73._8_8_ = 0;
  auVar73._0_8_ =
       dVar3 * *(double *)
                ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 8);
  auVar20 = vfmadd231sd_fma(auVar73,auVar72,auVar20);
  dVar4 = (this->m_z1).m_data[2];
  auVar74._8_8_ = 0;
  auVar74._0_8_ = dVar4;
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       *(double *)
        ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar44 = vfmadd231sd_fma(auVar20,auVar74,auVar44);
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       *(double *)
        ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar68._8_8_ = 0;
  auVar68._0_8_ =
       dVar3 * *(double *)
                ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 0x20);
  auVar20 = vfmadd231sd_fma(auVar68,auVar72,auVar45);
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       *(double *)
        ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar45 = vfmadd231sd_fma(auVar20,auVar74,auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       *(double *)
        ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       dVar3 * *(double *)
                ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 0x38);
  auVar20 = vfmadd231sd_fma(auVar21,auVar72,auVar16);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       *(double *)
        ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar15 = vfmadd231sd_fma(auVar20,auVar74,auVar23);
  dVar5 = (this->m_x2).m_data[0];
  auVar78._8_8_ = 0;
  auVar78._0_8_ = dVar5;
  vmovsd_avx512f(auVar78);
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  dVar6 = *(double *)
           ((long)&(pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8
           );
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar6;
  dVar7 = (this->m_x2).m_data[1];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar7;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = dVar6 * dVar7;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = dVar5;
  auVar20 = vfmadd231sd_avx512f(auVar76,auVar25,auVar79);
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       *(double *)
        ((long)&(pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  dVar5 = (this->m_x2).m_data[2];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar5;
  auVar16 = vfmadd231sd_fma(auVar20,auVar34,auVar40);
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       *(double *)
        ((long)&(pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  dVar6 = *(double *)
           ((long)&(pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x20);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar7 * dVar6;
  auVar20 = vfmadd231sd_avx512f(auVar75,auVar37,auVar79);
  auVar77._8_8_ = 0;
  auVar77._0_8_ =
       *(double *)
        ((long)&(pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar21 = vfmadd231sd_avx512f(auVar20,auVar77,auVar40);
  auVar82._8_8_ = 0;
  auVar82._0_8_ =
       *(double *)
        ((long)&(pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar20 = vmulsd_avx512f(auVar22,auVar82);
  auVar81._8_8_ = 0;
  auVar81._0_8_ =
       *(double *)
        ((long)&(pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar20 = vfmadd231sd_avx512f(auVar20,auVar81,auVar79);
  auVar85._8_8_ = 0;
  auVar85._0_8_ =
       *(double *)
        ((long)&(pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar22 = vfmadd231sd_avx512f(auVar20,auVar85,auVar40);
  dVar8 = (this->m_y2).m_data[0];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar8;
  dVar9 = (this->m_y2).m_data[1];
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar9;
  auVar20 = vmulsd_avx512f(auVar32,auVar63);
  auVar20 = vfmadd231sd_avx512f(auVar20,auVar39,auVar25);
  dVar10 = (this->m_y2).m_data[2];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar10;
  auVar23 = vfmadd231sd_avx512f(auVar20,auVar27,auVar34);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar6 * dVar9;
  auVar20 = vfmadd231sd_fma(auVar33,auVar39,auVar37);
  auVar20 = vfmadd231sd_avx512f(auVar20,auVar27,auVar77);
  auVar24 = vmulsd_avx512f(auVar82,auVar63);
  auVar24 = vfmadd231sd_avx512f(auVar24,auVar39,auVar81);
  auVar25 = vfmadd231sd_avx512f(auVar24,auVar27,auVar85);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = local_48;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_30;
  auVar24 = vsubsd_avx512f(auVar28,auVar24);
  dVar19 = local_40 - local_28;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = local_38;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_20;
  auVar26 = vsubsd_avx512f(auVar35,auVar26);
  auVar27 = vmulsd_avx512f(auVar45,auVar21);
  auVar27 = vfmadd231sd_avx512f(auVar27,auVar44,auVar16);
  auVar27 = vfmadd231sd_avx512f(auVar27,auVar15,auVar22);
  vmovsd_avx512f(auVar27);
  this->m_cur_par1 = this->m_cur_par1;
  auVar28 = vmulsd_avx512f(auVar45,auVar20);
  auVar28 = vfmadd231sd_avx512f(auVar28,auVar44,auVar23);
  auVar28 = vfmadd231sd_avx512f(auVar28,auVar15,auVar25);
  vmovsd_avx512f(auVar28);
  this->m_cur_par2 = this->m_cur_par2;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar19;
  auVar29 = vmulsd_avx512f(auVar45,auVar38);
  auVar29 = vfmadd231sd_avx512f(auVar29,auVar24,auVar44);
  auVar29 = vfmadd231sd_avx512f(auVar29,auVar26,auVar15);
  vmovsd_avx512f(auVar29);
  this->m_cur_dot = this->m_cur_dot;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = auVar21._0_8_ * dVar19;
  auVar30 = vfmadd231sd_avx512f(auVar30,auVar24,auVar16);
  auVar30 = vfmadd231sd_avx512f(auVar30,auVar26,auVar22);
  this->m_cur_dist = auVar30._0_8_;
  dVar6 = *(double *)
           ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x18);
  dVar11 = (pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  dVar12 = *(double *)
            ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
            8);
  dVar13 = *(double *)
            ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
            0x20);
  dVar14 = *(double *)
            ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
            0x28);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = dVar14;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = dVar6;
  auVar31 = vmulsd_avx512f(auVar20,auVar83);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = dVar11;
  auVar31 = vfmadd231sd_avx512f(auVar31,auVar86,auVar23);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = dVar13;
  auVar32 = vmulsd_avx512f(auVar20,auVar92);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = dVar12;
  auVar32 = vfmadd231sd_avx512f(auVar32,auVar88,auVar23);
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       *(double *)
        ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar36._8_8_ = 0;
  auVar36._0_8_ = auVar20._0_8_ * dVar14;
  auVar20 = vfmadd231sd_avx512f(auVar36,auVar46,auVar23);
  auVar23 = vmulsd_avx512f(auVar21,auVar83);
  auVar23 = vfmadd231sd_avx512f(auVar23,auVar86,auVar16);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = dVar6;
  auVar33 = vmulsd_avx512f(auVar38,auVar84);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = dVar11;
  auVar33 = vfmadd231sd_avx512f(auVar33,auVar24,auVar87);
  auVar34 = vmulsd_avx512f(auVar21,auVar92);
  auVar34 = vfmadd231sd_avx512f(auVar34,auVar88,auVar16);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar19;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = dVar13;
  auVar35 = vmulsd_avx512f(auVar41,auVar93);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = dVar12;
  auVar35 = vfmadd231sd_avx512f(auVar35,auVar24,auVar89);
  auVar80._8_8_ = 0;
  auVar80._0_8_ =
       *(double *)
        ((long)&(pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar36 = vmulsd_avx512f(auVar45,auVar80);
  auVar90._8_8_ = 0;
  auVar90._0_8_ =
       (pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar36 = vfmadd231sd_avx512f(auVar36,auVar90,auVar44);
  auVar37 = vmulsd_avx512f(auVar41,auVar80);
  auVar37 = vfmadd231sd_avx512f(auVar37,auVar24,auVar90);
  auVar91._8_8_ = 0;
  auVar91._0_8_ =
       *(double *)
        ((long)&(pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  auVar38 = vmulsd_avx512f(auVar45,auVar91);
  auVar94._8_8_ = 0;
  auVar94._0_8_ =
       *(double *)
        ((long)&(pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar38 = vfmadd231sd_avx512f(auVar38,auVar94,auVar44);
  auVar39 = vmulsd_avx512f(auVar41,auVar91);
  auVar39 = vfmadd231sd_avx512f(auVar39,auVar24,auVar94);
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       *(double *)
        ((long)&(pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar95._8_8_ = 0;
  auVar95._0_8_ =
       *(double *)
        ((long)&(pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar40 = vmulsd_avx512f(auVar45,auVar95);
  auVar40 = vfmadd231sd_avx512f(auVar40,auVar42,auVar44);
  auVar41 = vmulsd_avx512f(auVar41,auVar95);
  auVar41 = vfmadd231sd_avx512f(auVar41,auVar42,auVar24);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar19 * dVar14;
  auVar24 = vfmadd231sd_avx512f(auVar43,auVar24,auVar46);
  auVar42 = vmulsd_avx512f(auVar21,auVar64);
  auVar42 = vfmadd231sd_avx512f(auVar42,auVar46,auVar16);
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       *(double *)
        ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar31 = vfmadd231sd_avx512f(auVar31,auVar47,auVar25);
  auVar54._8_8_ = 0;
  auVar54._0_8_ =
       *(double *)
        ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar32 = vfmadd231sd_avx512f(auVar32,auVar54,auVar25);
  auVar65._8_8_ = 0;
  auVar65._0_8_ =
       *(double *)
        ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar25 = vfmadd231sd_avx512f(auVar20,auVar65,auVar25);
  auVar43 = vfmadd231sd_avx512f(auVar23,auVar47,auVar22);
  auVar33 = vfmadd231sd_avx512f(auVar33,auVar26,auVar47);
  auVar34 = vfmadd231sd_avx512f(auVar34,auVar54,auVar22);
  auVar35 = vfmadd231sd_avx512f(auVar35,auVar26,auVar54);
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       *(double *)
        ((long)&(pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar36 = vfmadd231sd_avx512f(auVar36,auVar48,auVar15);
  auVar37 = vfmadd231sd_avx512f(auVar37,auVar26,auVar48);
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       *(double *)
        ((long)&(pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar38 = vfmadd231sd_avx512f(auVar38,auVar49,auVar15);
  auVar39 = vfmadd231sd_avx512f(auVar39,auVar26,auVar49);
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       *(double *)
        ((long)&(pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar40 = vfmadd231sd_avx512f(auVar40,auVar50,auVar15);
  auVar41 = vfmadd231sd_avx512f(auVar41,auVar50,auVar26);
  auVar26 = vfmadd231sd_avx512f(auVar24,auVar26,auVar65);
  auVar42 = vfmadd231sd_avx512f(auVar42,auVar65,auVar22);
  vmovsd_avx512f(auVar27);
  (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
       = (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
         array[0];
  auVar20 = vmulsd_avx512f(auVar34,auVar74);
  auVar20 = vfmsub231sd_avx512f(auVar20,auVar69,auVar42);
  (this->m_cnstr_par1).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[0] = 0.0;
  (this->m_cnstr_par1).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[1] = 0.0;
  (this->m_cnstr_par1).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = 0.0;
  (this->m_cnstr_par1).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] = auVar20._0_8_;
  auVar20 = vmulsd_avx512f(auVar42,auVar72);
  auVar20 = vfmsub231sd_avx512f(auVar20,auVar74,auVar43);
  (this->m_cnstr_par1).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] = auVar20._0_8_;
  auVar20 = vmulsd_avx512f(auVar43,auVar69);
  auVar20 = vfmsub231sd_avx512f(auVar20,auVar72,auVar34);
  (this->m_cnstr_par1).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] = auVar20._0_8_;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = dVar5;
  auVar20 = vmulsd_avx512f(auVar38,auVar100);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = dVar7;
  auVar20 = vfmsub231sd_avx512f(auVar20,auVar98,auVar40);
  (this->m_cnstr_par1).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[0] = 0.0;
  (this->m_cnstr_par1).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[1] = 0.0;
  (this->m_cnstr_par1).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = 0.0;
  (this->m_cnstr_par1).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] = auVar20._0_8_;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = local_70;
  auVar20 = vmulsd_avx512f(auVar40,auVar96);
  auVar20 = vfmsub231sd_avx512f(auVar20,auVar100,auVar36);
  (this->m_cnstr_par1).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] = auVar20._0_8_;
  auVar20 = vmulsd_avx512f(auVar36,auVar98);
  auVar20 = vfmsub231sd_avx512f(auVar20,auVar96,auVar38);
  (this->m_cnstr_par1).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] = auVar20._0_8_;
  pdVar1 = (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
           .array + 1;
  vmovsd_avx512f(auVar28);
  *pdVar1 = *pdVar1;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar4 * auVar32._0_8_;
  auVar20 = vfmsub231sd_fma(auVar51,auVar69,auVar25);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar2 * auVar25._0_8_;
  auVar23 = vfmsub231sd_fma(auVar52,auVar74,auVar31);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar3 * auVar31._0_8_;
  auVar24 = vfmsub231sd_fma(auVar59,auVar72,auVar32);
  (this->m_cnstr_par2).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[0] = 0.0;
  (this->m_cnstr_par2).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[1] = 0.0;
  (this->m_cnstr_par2).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = 0.0;
  (this->m_cnstr_par2).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] = auVar20._0_8_;
  (this->m_cnstr_par2).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] = auVar23._0_8_;
  (this->m_cnstr_par2).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] = auVar24._0_8_;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar8;
  auVar20 = vmulsd_avx512f(auVar40,auVar60);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar10;
  auVar20 = vfmsub231sd_avx512f(auVar20,auVar36,auVar53);
  auVar23 = vmulsd_avx512f(auVar38,auVar53);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar9;
  auVar23 = vfmsub231sd_avx512f(auVar23,auVar56,auVar40);
  auVar24 = vmulsd_avx512f(auVar36,auVar56);
  auVar24 = vfmsub231sd_avx512f(auVar24,auVar38,auVar60);
  (this->m_cnstr_par2).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[0] = 0.0;
  (this->m_cnstr_par2).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[1] = 0.0;
  (this->m_cnstr_par2).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = 0.0;
  (this->m_cnstr_par2).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] = auVar23._0_8_;
  (this->m_cnstr_par2).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] = auVar20._0_8_;
  (this->m_cnstr_par2).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] = auVar24._0_8_;
  pdVar1 = (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
           .array + 2;
  vmovsd_avx512f(auVar29);
  *pdVar1 = *pdVar1;
  auVar20 = vmulsd_avx512f(auVar35,auVar74);
  auVar23 = vfmsub231sd_fma(auVar20,auVar69,auVar26);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar2 * auVar26._0_8_;
  auVar27 = vfmsub231sd_avx512f(auVar29,auVar74,auVar33);
  auVar20 = vmulsd_avx512f(auVar33,auVar69);
  auVar28 = vfmsub231sd_avx512f(auVar20,auVar72,auVar35);
  dVar6 = (this->m_p1).m_data[1];
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar6;
  dVar8 = (this->m_p1).m_data[2];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar8;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = dVar3 * dVar8;
  auVar24 = vfmsub231sd_fma(auVar61,auVar55,auVar74);
  dVar3 = (this->m_p1).m_data[0];
  auVar62._8_8_ = 0;
  auVar62._0_8_ = dVar3;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dVar4 * dVar3;
  auVar26 = vfmsub231sd_fma(auVar66,auVar57,auVar72);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar2 * dVar6;
  auVar25 = vfmsub231sd_fma(auVar31,auVar62,auVar69);
  auVar20 = vunpcklpd_avx(auVar44,auVar45);
  (this->m_cnstr_dot).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[0] = -auVar20._0_8_;
  (this->m_cnstr_dot).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[1] = -auVar20._8_8_;
  auVar70._0_8_ = -auVar15._0_8_;
  auVar70._8_8_ = auVar15._8_8_ ^ 0x8000000000000000;
  dVar2 = (double)vmovlpd_avx(auVar70);
  (this->m_cnstr_dot).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = dVar2;
  (this->m_cnstr_dot).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] = auVar23._0_8_ - auVar24._0_8_;
  (this->m_cnstr_dot).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] = auVar27._0_8_ - auVar26._0_8_;
  (this->m_cnstr_dot).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] = auVar28._0_8_ - auVar25._0_8_;
  auVar20 = vmulsd_avx512f(auVar34,auVar57);
  auVar23 = vfmsub231sd_avx512f(auVar20,auVar55,auVar42);
  auVar20 = vmulsd_avx512f(auVar42,auVar62);
  auVar20 = vfmsub231sd_avx512f(auVar20,auVar43,auVar57);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = (this->m_p2).m_data[1];
  auVar24 = vmulsd_avx512f(auVar43,auVar55);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = (this->m_p2).m_data[2];
  auVar24 = vfmsub231sd_avx512f(auVar24,auVar62,auVar34);
  auVar26 = vmulsd_avx512f(auVar38,auVar67);
  auVar26 = vfmsub231sd_avx512f(auVar26,auVar58,auVar40);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = (this->m_p2).m_data[0];
  auVar25 = vmulsd_avx512f(auVar40,auVar71);
  auVar25 = vfmsub231sd_avx512f(auVar25,auVar67,auVar36);
  auVar27 = vmulsd_avx512f(auVar36,auVar58);
  auVar27 = vfmsub231sd_avx512f(auVar27,auVar71,auVar38);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = dVar5;
  auVar28 = vmulsd_avx512f(auVar39,auVar101);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = dVar7;
  auVar28 = vfmsub231sd_avx512f(auVar28,auVar99,auVar41);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = local_70;
  auVar29 = vmulsd_avx512f(auVar41,auVar97);
  auVar29 = vfmsub231sd_avx512f(auVar29,auVar101,auVar37);
  auVar31 = vmulsd_avx512f(auVar37,auVar99);
  auVar31 = vfmsub231sd_avx512f(auVar31,auVar97,auVar39);
  auVar32 = vmulsd_avx512f(auVar99,auVar67);
  auVar32 = vfmsub231sd_avx512f(auVar32,auVar58,auVar101);
  auVar33 = vmulsd_avx512f(auVar101,auVar71);
  auVar33 = vfmsub231sd_avx512f(auVar33,auVar97,auVar67);
  auVar34 = vmulsd_avx512f(auVar97,auVar58);
  auVar34 = vfmsub231sd_avx512f(auVar34,auVar71,auVar99);
  (this->m_cnstr_dot).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[0] = auVar44._0_8_;
  (this->m_cnstr_dot).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[1] = auVar45._0_8_;
  (this->m_cnstr_dot).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = auVar15._0_8_;
  (this->m_cnstr_dot).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] = auVar26._0_8_;
  (this->m_cnstr_dot).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] = auVar25._0_8_;
  (this->m_cnstr_dot).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] = auVar27._0_8_;
  (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
       = auVar30._0_8_ - this->m_dist;
  auVar20 = vunpcklpd_avx(auVar20,auVar24);
  auVar44 = vunpcklpd_avx(auVar22,auVar23);
  auVar45 = vunpcklpd_avx(auVar16,auVar21);
  (this->m_cnstr_dist).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[0] = -auVar45._0_8_;
  (this->m_cnstr_dist).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[1] = -auVar45._8_8_;
  (this->m_cnstr_dist).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = -auVar44._0_8_;
  (this->m_cnstr_dist).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] = -auVar44._8_8_;
  (this->m_cnstr_dist).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] = -auVar20._0_8_;
  (this->m_cnstr_dist).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] = -auVar20._8_8_;
  auVar20 = vaddsd_avx512f(auVar28,auVar32);
  auVar44 = vaddsd_avx512f(auVar29,auVar33);
  auVar45 = vaddsd_avx512f(auVar31,auVar34);
  (this->m_cnstr_dist).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[0] = auVar16._0_8_;
  (this->m_cnstr_dist).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[1] = auVar21._0_8_;
  (this->m_cnstr_dist).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = auVar22._0_8_;
  (this->m_cnstr_dist).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] = auVar20._0_8_;
  (this->m_cnstr_dist).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] = auVar44._0_8_;
  (this->m_cnstr_dist).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] = auVar45._0_8_;
  return;
}

Assistant:

void ChLinkRevoluteTranslational::Update(double time, bool update_assets) {
    // Inherit time changes of parent class (ChLink)
    ChLink::UpdateTime(time);

    // Express the body locations and direction in absolute frame
    ChVector<> p1_abs = Body1->TransformPointLocalToParent(m_p1);
    ChVector<> p2_abs = Body2->TransformPointLocalToParent(m_p2);
    ChVector<> z1_abs = Body1->TransformDirectionLocalToParent(m_z1);
    ChVector<> x2_abs = Body2->TransformDirectionLocalToParent(m_x2);
    ChVector<> y2_abs = Body2->TransformDirectionLocalToParent(m_y2);
    ChVector<> d12_abs = p2_abs - p1_abs;

    // Update current constraint quantities
    m_cur_par1 = Vdot(z1_abs, x2_abs);
    m_cur_par2 = Vdot(z1_abs, y2_abs);
    m_cur_dot = Vdot(d12_abs, z1_abs);
    m_cur_dist = Vdot(d12_abs, x2_abs);

    // Calculate a few more quantities
    // (express directions on one body in the frame ot the other body)
    ChVector<> z1_2 = Body2->TransformDirectionParentToLocal(z1_abs);
    ChVector<> x2_1 = Body1->TransformDirectionParentToLocal(x2_abs);
    ChVector<> y2_1 = Body1->TransformDirectionParentToLocal(y2_abs);

    ChVector<> d12_1 = Body1->TransformDirectionParentToLocal(d12_abs);
    ChVector<> d12_2 = Body2->TransformDirectionParentToLocal(d12_abs);

    // First constraint (par1)
    {
        // Cache constraint violation
        m_C(0) = m_cur_par1;

        // Set Jacobian w.r.t. states of Body 1
        ChVector<> Phi_pi1 = Vcross(m_z1, x2_1);

        m_cnstr_par1.Get_Cq_a()(0) = 0;
        m_cnstr_par1.Get_Cq_a()(1) = 0;
        m_cnstr_par1.Get_Cq_a()(2) = 0;

        m_cnstr_par1.Get_Cq_a()(3) = Phi_pi1.x();
        m_cnstr_par1.Get_Cq_a()(4) = Phi_pi1.y();
        m_cnstr_par1.Get_Cq_a()(5) = Phi_pi1.z();

        // Set Jacobian w.r.t. states of Body 2
        ChVector<> Phi_pi2 = Vcross(m_x2, z1_2);

        m_cnstr_par1.Get_Cq_b()(0) = 0;
        m_cnstr_par1.Get_Cq_b()(1) = 0;
        m_cnstr_par1.Get_Cq_b()(2) = 0;

        m_cnstr_par1.Get_Cq_b()(3) = Phi_pi2.x();
        m_cnstr_par1.Get_Cq_b()(4) = Phi_pi2.y();
        m_cnstr_par1.Get_Cq_b()(5) = Phi_pi2.z();
    }

    // Second constraint (par2)
    {
        // Cache constraint violation
        m_C(1) = m_cur_par2;

        // Set Jacobian w.r.t. states of Body 1
        ChVector<> Phi_pi1 = Vcross(m_z1, y2_1);

        m_cnstr_par2.Get_Cq_a()(0) = 0;
        m_cnstr_par2.Get_Cq_a()(1) = 0;
        m_cnstr_par2.Get_Cq_a()(2) = 0;

        m_cnstr_par2.Get_Cq_a()(3) = Phi_pi1.x();
        m_cnstr_par2.Get_Cq_a()(4) = Phi_pi1.y();
        m_cnstr_par2.Get_Cq_a()(5) = Phi_pi1.z();

        // Set Jacobian w.r.t. states of Body 2
        ChVector<> Phi_pi2 = Vcross(m_y2, z1_2);

        m_cnstr_par2.Get_Cq_b()(0) = 0;
        m_cnstr_par2.Get_Cq_b()(1) = 0;
        m_cnstr_par2.Get_Cq_b()(2) = 0;

        m_cnstr_par2.Get_Cq_b()(3) = Phi_pi2.x();
        m_cnstr_par2.Get_Cq_b()(4) = Phi_pi2.y();
        m_cnstr_par2.Get_Cq_b()(5) = Phi_pi2.z();
    }

    // Third constraint (dot)
    {
        // Cache constraint violation
        m_C(2) = m_cur_dot;

        // Set Jacobian w.r.t. states of Body 1
        ChVector<> Phi_pi1 = Vcross(m_z1, d12_1) - Vcross(m_p1, m_z1);

        m_cnstr_dot.Get_Cq_a()(0) = -z1_abs.x();
        m_cnstr_dot.Get_Cq_a()(1) = -z1_abs.y();
        m_cnstr_dot.Get_Cq_a()(2) = -z1_abs.z();

        m_cnstr_dot.Get_Cq_a()(3) = Phi_pi1.x();
        m_cnstr_dot.Get_Cq_a()(4) = Phi_pi1.y();
        m_cnstr_dot.Get_Cq_a()(5) = Phi_pi1.z();

        // Set Jacobian w.r.t. states of Body 2
        ChVector<> Phi_pi2 = Vcross(m_p2, z1_2);

        m_cnstr_dot.Get_Cq_b()(0) = z1_abs.x();
        m_cnstr_dot.Get_Cq_b()(1) = z1_abs.y();
        m_cnstr_dot.Get_Cq_b()(2) = z1_abs.z();

        m_cnstr_dot.Get_Cq_b()(3) = Phi_pi2.x();
        m_cnstr_dot.Get_Cq_b()(4) = Phi_pi2.y();
        m_cnstr_dot.Get_Cq_b()(5) = Phi_pi2.z();
    }

    // Fourth constraint (dist)
    {
        // Cache constraint violation
        m_C(3) = m_cur_dist - m_dist;

        // Set Jacobian w.r.t. states of Body 1
        ChVector<> Phi_pi1 = -Vcross(m_p1, x2_1);

        m_cnstr_dist.Get_Cq_a()(0) = -x2_abs.x();
        m_cnstr_dist.Get_Cq_a()(1) = -x2_abs.y();
        m_cnstr_dist.Get_Cq_a()(2) = -x2_abs.z();

        m_cnstr_dist.Get_Cq_a()(3) = Phi_pi1.x();
        m_cnstr_dist.Get_Cq_a()(4) = Phi_pi1.y();
        m_cnstr_dist.Get_Cq_a()(5) = Phi_pi1.z();

        // Set Jacobian w.r.t. states of Body 2
        ChVector<> Phi_pi2 = Vcross(m_x2, d12_2) + Vcross(m_p2, m_x2);

        m_cnstr_dist.Get_Cq_b()(0) = x2_abs.x();
        m_cnstr_dist.Get_Cq_b()(1) = x2_abs.y();
        m_cnstr_dist.Get_Cq_b()(2) = x2_abs.z();

        m_cnstr_dist.Get_Cq_b()(3) = Phi_pi2.x();
        m_cnstr_dist.Get_Cq_b()(4) = Phi_pi2.y();
        m_cnstr_dist.Get_Cq_b()(5) = Phi_pi2.z();
    }
}